

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O1

bool __thiscall Js::AsmJsModuleCompiler::CommitModule(AsmJsModuleCompiler *this)

{
  undefined1 *puVar1;
  char cVar2;
  RegSlot RVar3;
  RegSlot RVar4;
  Type TVar5;
  FuncInfo *this_00;
  ParseNodeVar *this_01;
  ByteCodeGenerator *this_02;
  uint *puVar6;
  AsmJsSymbol *sym;
  code *pcVar7;
  int i;
  int i_00;
  int i_01;
  Type TVar8;
  Type TVar9;
  Type TVar10;
  Type TVar11;
  Type TVar12;
  Type TVar13;
  Type TVar14;
  bool bVar15;
  Which WVar16;
  type_info tVar17;
  FunctionBody *pFVar18;
  AsmJsModuleInfo *this_03;
  undefined4 *puVar19;
  IdentPtr pid;
  AsmJsFunctionDeclaration *this_04;
  EntryType *pEVar20;
  AsmJsSymbol **ppAVar21;
  Recycler *alloc;
  AsmJsVar *pAVar22;
  ModuleVar *pMVar23;
  AsmJsModuleArg *pAVar24;
  AsmJsImportFunction *pAVar25;
  ModuleFunctionImport *pMVar26;
  ModuleFunctionTable *pMVar27;
  Type *pTVar28;
  AsmJsConstantImport *pAVar29;
  ModuleVarImport *pMVar30;
  AsmJsMathConst *pAVar31;
  AsmJsFunc *pAVar32;
  ModuleFunction *pMVar33;
  AsmJsMathFunction *pAVar34;
  uint *this_05;
  uint uVar35;
  int index;
  int iVar36;
  ulong uVar37;
  undefined1 local_d8 [8];
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  exportIter;
  undefined **local_98;
  AsmJsSlot *slot;
  size_t local_88;
  char *local_80;
  DWORD local_78;
  int local_70;
  Type local_6c;
  FunctionBody *local_68;
  AsmJsModuleCompiler *local_60;
  undefined4 *local_58;
  FuncInfo *local_50;
  AsmJsModuleInfo *local_48;
  int local_3c;
  PropertyId local_38;
  int local_34;
  
  this_00 = this->mModuleFunctionNode->funcInfo;
  pFVar18 = FuncInfo::GetParsedFunctionBody(this_00);
  this_03 = FunctionBody::AllocateAsmJsModuleInfo(pFVar18);
  local_50 = this_00;
  if (((this_00->byteCodeFunction->super_FunctionProxy).field_0x45 & 0x20) != 0) {
    if (this->mModuleFunctionNode->pnodeName == (ParseNodeVar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar19 = 1;
      bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                   ,0x7e,"(GetModuleFunctionNode()->pnodeName)",
                                   "GetModuleFunctionNode()->pnodeName");
      if (!bVar15) goto LAB_00957856;
      *puVar19 = 0;
    }
    if ((this->mModuleFunctionNode->pnodeName->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar19 = 1;
      bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                   ,0x7f,"(GetModuleFunctionNode()->pnodeName->nop == knopVarDecl)",
                                   "GetModuleFunctionNode()->pnodeName->nop == knopVarDecl");
      if (!bVar15) {
LAB_00957856:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar19 = 0;
    }
    this_01 = this->mModuleFunctionNode->pnodeName;
    bVar15 = Symbol::IsInSlot(this_01->sym,this->mCx->byteCodeGenerator,this_00,false);
    if (bVar15) {
      this_02 = this->mCx->byteCodeGenerator;
      pid = ParseNode::name(&this_01->super_ParseNode);
      ByteCodeGenerator::AssignPropertyId(this_02,pid);
      this_04 = (AsmJsFunctionDeclaration *)
                new<Memory::ArenaAllocator>(0x38,&this->mAllocator,0x366bee);
      AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
                (this_04,this_01->pid,ClosureFunction,&this->mAllocator);
      (this_04->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014fea58;
      DefineIdentifier(this,this_01->pid,(AsmJsSymbol *)this_04);
    }
  }
  uVar35 = 3;
  if ((this->mBufferArgName == (PropertyName)0x0) &&
     (uVar35 = 2, this->mForeignArgName == (PropertyName)0x0)) {
    uVar35 = (uint)(this->mStdLibArgName != (PropertyName)0x0);
  }
  iVar36 = (this->mFunctionTableArray).
           super_ReadOnlyList<Js::AsmJsFunctionTable_*,_Memory::ArenaAllocator,_DefaultComparer>.
           count;
  RVar3 = (this->mImportFunctions).mRegisterCount;
  RVar4 = (this->mImportFunctions).mNbConst;
  local_68 = pFVar18;
  local_48 = this_03;
  AsmJsModuleInfo::SetFunctionCount
            (this_03,(this->mFunctionArray).
                     super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>.
                     count);
  AsmJsModuleInfo::SetFunctionTableCount(this_03,iVar36);
  AsmJsModuleInfo::SetFunctionImportCount(this_03,RVar3 - RVar4);
  AsmJsModuleInfo::SetVarCount(this_03,this->mVarCount);
  AsmJsModuleInfo::SetVarImportCount(this_03,this->mVarImportCount);
  pFVar18 = local_68;
  this_03->mArgInCount = uVar35;
  TVar8 = (this->mModuleMemory).mStdLibOffset;
  TVar9 = (this->mModuleMemory).mDoubleOffset;
  TVar10 = (this->mModuleMemory).mFuncOffset;
  TVar11 = (this->mModuleMemory).mFFIOffset;
  TVar12 = (this->mModuleMemory).mFuncPtrOffset;
  TVar13 = (this->mModuleMemory).mIntOffset;
  TVar14 = (this->mModuleMemory).mFloatOffset;
  (this_03->mModuleMemory).mArrayBufferOffset = (this->mModuleMemory).mArrayBufferOffset;
  (this_03->mModuleMemory).mStdLibOffset = TVar8;
  (this_03->mModuleMemory).mDoubleOffset = TVar9;
  (this_03->mModuleMemory).mFuncOffset = TVar10;
  (this_03->mModuleMemory).mFFIOffset = TVar11;
  (this_03->mModuleMemory).mFuncPtrOffset = TVar12;
  (this_03->mModuleMemory).mIntOffset = TVar13;
  (this_03->mModuleMemory).mFloatOffset = TVar14;
  (this_03->mModuleMemory).mMemorySize = (this->mModuleMemory).mMemorySize;
  (this_03->mAsmMathBuiltinUsed).data[0].word = (this->mAsmMathBuiltinUsedBV).data[0].word;
  (this_03->mAsmArrayBuiltinUsed).data[0].word = (this->mAsmArrayBuiltinUsedBV).data[0].word;
  this_03->mMaxHeapAccess = this->mMaxHeapAccess;
  ParseableFunctionInfo::SetInParamsCount(&local_68->super_ParseableFunctionInfo,4);
  ParseableFunctionInfo::SetReportedInParamsCount(&pFVar18->super_ParseableFunctionInfo,4);
  FunctionBody::CheckAndSetConstantCount(pFVar18,2);
  FunctionBody::CreateConstantTable(pFVar18);
  FunctionBody::CheckAndSetVarCount(pFVar18,3);
  puVar1 = &(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
  *puVar1 = *puVar1 | 2;
  puVar1 = &(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  *puVar1 = *puVar1 | 0x40;
  FunctionBody::NewObjectLiteral(pFVar18);
  AsmJSByteCodeGenerator::EmitEmptyByteCode
            (local_50,this->mCx->byteCodeGenerator,&this->mModuleFunctionNode->super_ParseNode);
  this_03->mExportFunctionIndex = this->mExportFuncIndex;
  AsmJsModuleInfo::SetExportsCount(this_03,(this->mExports).count - (this->mExports).freeCount);
  JsUtil::
  BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_d8,&this->mExports);
  bVar15 = JsUtil::
           BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::
           EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                      *)local_d8);
  local_60 = this;
  if (bVar15) {
    iVar36 = 0;
    do {
      pEVar20 = JsUtil::
                BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::
                IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                ::Current((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                           *)local_d8);
      puVar6 = (this_03->mExportsFunctionLocation).ptr;
      (&(this_03->mExports).ptr[1].count)[iVar36] =
           (pEVar20->
           super_DefaultHashedEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           ).super_KeyValueEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.
           super_ValueEntry<Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>_>
           .super_KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.value.id
      ;
      puVar6[iVar36] =
           (pEVar20->
           super_DefaultHashedEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           ).super_KeyValueEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.
           super_ValueEntry<Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>_>
           .super_KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.value.
           location;
      JsUtil::
      BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                  *)local_d8);
      iVar36 = iVar36 + 1;
      bVar15 = JsUtil::
               BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::
               EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
               ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                          *)local_d8);
    } while (bVar15);
  }
  iVar36 = (local_60->mModuleEnvironment).count - (local_60->mModuleEnvironment).freeCount;
  AsmJsModuleInfo::InitializeSlotMap(this_03,iVar36);
  if (0 < iVar36) {
    local_68 = (FunctionBody *)&local_60->mModuleEnvironment;
    exportIter.
    super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
    ._24_8_ = (this_03->mSlotMap).ptr;
    local_58 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_3c = 0;
    i_00 = 0;
    i_01 = 0;
    i = 0;
    index = 0;
    local_34 = iVar36;
    do {
      ppAVar21 = JsUtil::
                 BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetValueAt((BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               *)local_68,index);
      sym = *ppAVar21;
      if (sym == (AsmJsSymbol *)0x0) goto LAB_00957836;
      local_98 = &AsmJsSlot::typeinfo;
      slot = (AsmJsSlot *)0x0;
      local_88 = 0xffffffffffffffff;
      local_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
      ;
      local_78 = 200;
      alloc = Memory::Recycler::TrackAllocInfo
                        (local_60->mCx->scriptContext->recycler,
                         (TrackAllocData *)&stack0xffffffffffffff68);
      local_98 = (undefined **)new<Memory::Recycler>(0x18,alloc,0x781bfc);
      *local_98 = (undefined *)0x0;
      *(undefined8 *)((long)local_98 + 8) = 0;
      *(undefined8 *)((long)local_98 + 0x10) = 0;
      *(SymbolType *)((long)local_98 + 4) = sym->mType;
      local_38 = sym->mName->m_propertyId;
      JsUtil::
      BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)exportIter.
                    super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                    ._24_8_,&local_38,(AsmJsSlot **)&stack0xffffffffffffff68);
      switch(sym->mType) {
      case Variable:
        pAVar22 = AsmJsVar::FromSymbol(sym);
        pMVar23 = AsmJsModuleInfo::GetVar(this_03,local_3c);
        pMVar23->location = (pAVar22->super_AsmJsVarBase).mLocation;
        local_38 = CONCAT31(local_38._1_3_,
                            (pAVar22->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14);
        WVar16 = AsmJsVarType::which((AsmJsVarType *)&local_38);
        pMVar23->type = WVar16;
        cVar2 = (pAVar22->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14;
        if (cVar2 == '\x03') {
          (pMVar23->initialiser).intInit = (Type)(pAVar22->mConstInitialiser).floatVal;
        }
        else if (cVar2 == '\x02') {
          pMVar23->initialiser = (Type)pAVar22->mConstInitialiser;
        }
        else if (cVar2 == '\0') {
          (pMVar23->initialiser).intInit = (Type)(pAVar22->mConstInitialiser).floatVal;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar19 = local_58;
          *local_58 = 1;
          bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                       ,0xe1,"((0))","UNREACHED");
          if (!bVar15) goto LAB_00957856;
          *puVar19 = 0;
        }
        local_3c = local_3c + 1;
        iVar36 = (*(pAVar22->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol[1])(pAVar22);
        pMVar23->isMutable = SUB41(iVar36,0);
        *(Type *)local_98 = pMVar23->location;
        local_38 = CONCAT31(local_38._1_3_,
                            (pAVar22->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14);
        tVar17 = (type_info)AsmJsVarType::which((AsmJsVarType *)&local_38);
        *(type_info *)((long)local_98 + 8) = tVar17;
        *(byte *)((long)local_98 + 0x10) = pMVar23->isMutable ^ 1;
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar19 = local_58;
        *local_58 = 1;
        bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                     ,0x13c,"((0))","(0)");
        if (!bVar15) goto LAB_00957856;
        *puVar19 = 0;
        break;
      case MathConstant:
        pAVar31 = AsmJsMathConst::FromSymbol(sym);
        *(double *)((long)local_98 + 8) = *pAVar31->mVal;
        break;
      case ConstantImport:
        pAVar29 = AsmJsConstantImport::FromSymbol(sym);
        pMVar30 = AsmJsModuleInfo::GetVarImport(local_48,i_00);
        pMVar30->location = (pAVar29->super_AsmJsVarBase).mLocation;
        pMVar30->field = pAVar29->mField->m_propertyId;
        local_38 = CONCAT31(local_38._1_3_,
                            (pAVar29->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14);
        tVar17 = (type_info)AsmJsVarType::which((AsmJsVarType *)&local_38);
        pMVar30->type = (Type)tVar17;
        *(Type *)local_98 = pMVar30->location;
        *(type_info *)((long)local_98 + 8) = tVar17;
        this_03 = local_48;
        iVar36 = local_34;
        i_00 = i_00 + 1;
        goto LAB_00957836;
      case ImportFunction:
        pAVar25 = AsmJsImportFunction::FromSymbol(sym);
        pMVar26 = AsmJsModuleInfo::GetFunctionImport(this_03,i);
        TVar5 = (pAVar25->super_AsmJsFunctionDeclaration).mLocation;
        pMVar26->location = TVar5;
        pMVar26->field = pAVar25->mField->m_propertyId;
        *(Type *)local_98 = TVar5;
        i = i + 1;
        break;
      case FuncPtrTable:
        local_50 = (FuncInfo *)AsmJsFunctionTable::FromSymbol(sym);
        TVar5 = *(Type *)((long)&local_50->currentChildFunction + 4);
        uVar35 = *(uint *)&local_50->name;
        AsmJsModuleInfo::SetFunctionTableSize(this_03,TVar5,uVar35);
        local_6c = TVar5;
        pMVar27 = AsmJsModuleInfo::GetFunctionTable(this_03,TVar5);
        if ((ulong)uVar35 != 0) {
          this_05 = &local_50->nextForInLoopLevel;
          uVar37 = 0;
          local_70 = index;
          do {
            if (*(uint *)&local_50->name <= uVar37) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar19 = local_58;
              *local_58 = 1;
              bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                           ,0x2e5,"(index < mSize)","index < mSize");
              if (!bVar15) goto LAB_00957856;
              *puVar19 = 0;
              index = local_70;
            }
            pTVar28 = JsUtil::
                      List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item((List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                              *)this_05,(int)uVar37);
            (pMVar27->moduleFunctionIndex).ptr[uVar37] = *pTVar28;
            uVar37 = uVar37 + 1;
          } while (uVar35 != uVar37);
        }
        *(uint *)((long)local_98 + 8) = uVar35;
        *(Type *)local_98 = local_6c;
        this_03 = local_48;
        break;
      case ModuleFunction:
        pAVar32 = AsmJsFunc::FromSymbol(sym);
        pMVar33 = AsmJsModuleInfo::GetFunction(this_03,i_01);
        TVar5 = (pAVar32->super_AsmJsFunctionDeclaration).mLocation;
        pMVar33->location = TVar5;
        *(Type *)local_98 = TVar5;
        i_01 = i_01 + 1;
        break;
      case ArrayView:
        pAVar24 = (AsmJsModuleArg *)AsmJsArrayView::FromSymbol(sym);
        goto LAB_00957716;
      case MathBuiltinFunction:
        pAVar34 = AsmJsMathFunction::FromSymbol(sym);
        goto LAB_0095773a;
      case TypedArrayBuiltinFunction:
        pAVar34 = (AsmJsMathFunction *)AsmJsTypedArrayFunction::FromSymbol(sym);
LAB_0095773a:
        *(AsmJSMathBuiltinFunction *)((long)local_98 + 8) = pAVar34->mBuiltIn;
        break;
      case ModuleArgument:
        pAVar24 = AsmJsModuleArg::FromSymbol(sym);
LAB_00957716:
        *(undefined1 *)((long)local_98 + 8) = (pAVar24->super_AsmJsSymbol).field_0x14;
        break;
      case ClosureFunction:
        break;
      }
      iVar36 = local_34;
LAB_00957836:
      index = index + 1;
    } while (index != iVar36);
  }
  return true;
}

Assistant:

bool AsmJsModuleCompiler::CommitModule()
    {
        FuncInfo* funcInfo = GetModuleFunctionNode()->funcInfo;
        FunctionBody* functionBody = funcInfo->GetParsedFunctionBody();
        AsmJsModuleInfo* asmInfo = functionBody->AllocateAsmJsModuleInfo();

        if (funcInfo->byteCodeFunction->GetIsNamedFunctionExpression())
        {
            Assert(GetModuleFunctionNode()->pnodeName);
            Assert(GetModuleFunctionNode()->pnodeName->nop == knopVarDecl);
            ParseNodeVar * nameNode = GetModuleFunctionNode()->pnodeName;
            if (nameNode->sym->IsInSlot(GetByteCodeGenerator(), funcInfo))
            {
                GetByteCodeGenerator()->AssignPropertyId(nameNode->name());
                // if module is a named function expression, we may need to restore this for debugger
                AsmJsClosureFunction* closure = Anew(&mAllocator, AsmJsClosureFunction, nameNode->pid, AsmJsSymbol::ClosureFunction, &mAllocator);
                DefineIdentifier(nameNode->pid, closure);
            }
        }

        int argCount = 0;
        if (mBufferArgName)
        {
            argCount = 3;
        }
        else if (mForeignArgName)
        {
            argCount = 2;
        }
        else if (mStdLibArgName)
        {
            argCount = 1;
        }

        const int functionCount = mFunctionArray.Count();
        const int functionTableCount = mFunctionTableArray.Count();
        const int importFunctionCount = mImportFunctions.GetTotalVarCount();
        asmInfo->SetFunctionCount(functionCount);
        asmInfo->SetFunctionTableCount(functionTableCount);
        asmInfo->SetFunctionImportCount(importFunctionCount);
        asmInfo->SetVarCount(mVarCount);
        asmInfo->SetVarImportCount(mVarImportCount);
        asmInfo->SetArgInCount(argCount);
        asmInfo->SetModuleMemory(mModuleMemory);
        asmInfo->SetAsmMathBuiltinUsed(mAsmMathBuiltinUsedBV);
        asmInfo->SetAsmArrayBuiltinUsed(mAsmArrayBuiltinUsedBV);
        asmInfo->SetMaxHeapAccess(mMaxHeapAccess);
        int varCount = 3; // 3 possible arguments

        functionBody->SetInParamsCount(4); // Always set 4 inParams so the memory space is the same (globalEnv,stdlib,foreign,buffer)
        functionBody->SetReportedInParamsCount(4);
        functionBody->CheckAndSetConstantCount(2); // Return register + Root
        functionBody->CreateConstantTable();
        functionBody->CheckAndSetVarCount(varCount);
        functionBody->SetIsAsmjsMode(true);
        functionBody->NewObjectLiteral(); // allocate one object literal for the export object

        AsmJSByteCodeGenerator::EmitEmptyByteCode(funcInfo, GetByteCodeGenerator(), GetModuleFunctionNode());

        // Create export module proxy
        asmInfo->SetExportFunctionIndex(mExportFuncIndex);
        asmInfo->SetExportsCount(mExports.Count());
        auto exportIter = mExports.GetIterator();

        for (int exportIndex = 0; exportIter.IsValid(); ++exportIndex)
        {
            const AsmJsModuleExport& exMod = exportIter.CurrentValue();
            auto ex = asmInfo->GetExport(exportIndex);
            *ex.id = exMod.id;
            *ex.location = exMod.location;
            exportIter.MoveNext();
        }

        int iVar = 0, iVarImp = 0, iFunc = 0, iFuncImp = 0;
        const int moduleEnvCount = mModuleEnvironment.Count();
        asmInfo->InitializeSlotMap(moduleEnvCount);
        auto slotMap = asmInfo->GetAsmJsSlotMap();
        for (int i = 0; i < moduleEnvCount; i++)
        {
            AsmJsSymbol* sym = mModuleEnvironment.GetValueAt(i);
            if (sym)
            {
                AsmJsSlot * slot = RecyclerNewLeaf(GetScriptContext()->GetRecycler(), AsmJsSlot);
                slot->symType = sym->GetSymbolType();
                slotMap->AddNew(sym->GetName()->GetPropertyId(), slot);
                switch (sym->GetSymbolType())
                {
                case AsmJsSymbol::Variable:
                {
                    AsmJsVar* var = AsmJsVar::FromSymbol(sym);
                    auto& modVar = asmInfo->GetVar(iVar++);
                    modVar.location = var->GetLocation();
                    modVar.type = var->GetVarType().which();
                    if (var->GetVarType().isInt())
                    {
                        modVar.initialiser.intInit = var->GetIntInitialiser();
                    }
                    else if (var->GetVarType().isFloat())
                    {
                        modVar.initialiser.floatInit = var->GetFloatInitialiser();
                    }
                    else if (var->GetVarType().isDouble())
                    {
                        modVar.initialiser.doubleInit = var->GetDoubleInitialiser();
                    }
                    else
                    {
                        Assert(UNREACHED);
                    }

                    modVar.isMutable = var->isMutable();

                    slot->location = modVar.location;
                    slot->varType = var->GetVarType().which();
                    slot->isConstVar = !modVar.isMutable;
                    break;
                }
                case AsmJsSymbol::ConstantImport:
                {
                    AsmJsConstantImport* var = AsmJsConstantImport::FromSymbol(sym);
                    auto& modVar = asmInfo->GetVarImport(iVarImp++);
                    modVar.location = var->GetLocation();
                    modVar.field = var->GetField()->GetPropertyId();
                    modVar.type = var->GetVarType().which();

                    slot->location = modVar.location;
                    slot->varType = modVar.type;
                    break;
                }
                case AsmJsSymbol::ImportFunction:
                {
                    AsmJsImportFunction* func = AsmJsImportFunction::FromSymbol(sym);
                    auto& modVar = asmInfo->GetFunctionImport(iFuncImp++);
                    modVar.location = func->GetFunctionIndex();
                    modVar.field = func->GetField()->GetPropertyId();

                    slot->location = modVar.location;
                    break;
                }
                case AsmJsSymbol::FuncPtrTable:
                {
                    AsmJsFunctionTable* funcTable = AsmJsFunctionTable::FromSymbol(sym);
                    const uint size = funcTable->GetSize();
                    const RegSlot index = funcTable->GetFunctionIndex();
                    asmInfo->SetFunctionTableSize(index, size);
                    auto& modTable = asmInfo->GetFunctionTable(index);
                    for (uint j = 0; j < size; j++)
                    {
                        modTable.moduleFunctionIndex[j] = funcTable->GetModuleFunctionIndex(j);
                    }
                    slot->funcTableSize = size;
                    slot->location = index;

                    break;
                }
                case AsmJsSymbol::ModuleFunction:
                {
                    AsmJsFunc* func = AsmJsFunc::FromSymbol(sym);
                    auto& modVar = asmInfo->GetFunction(iFunc++);
                    modVar.location = func->GetFunctionIndex();
                    slot->location = modVar.location;
                    break;
                }
                case AsmJsSymbol::ArrayView:
                {
                    AsmJsArrayView * var = AsmJsArrayView::FromSymbol(sym);
                    slot->viewType = var->GetViewType();
                    break;
                }
                case AsmJsSymbol::ModuleArgument:
                {
                    AsmJsModuleArg * arg = AsmJsModuleArg::FromSymbol(sym);
                    slot->argType = arg->GetArgType();
                    break;
                }
                // used only for module validation
                case AsmJsSymbol::MathConstant:
                {
                    AsmJsMathConst * constVar = AsmJsMathConst::FromSymbol(sym);
                    slot->mathConstVal = *constVar->GetVal();
                    break;
                }
                case AsmJsSymbol::MathBuiltinFunction:
                {
                    AsmJsMathFunction * mathFunc = AsmJsMathFunction::FromSymbol(sym);
                    slot->builtinMathFunc = mathFunc->GetMathBuiltInFunction();
                    break;
                }
                case AsmJsSymbol::TypedArrayBuiltinFunction:
                {
                    AsmJsTypedArrayFunction * mathFunc = AsmJsTypedArrayFunction::FromSymbol(sym);
                    slot->builtinArrayFunc = mathFunc->GetArrayBuiltInFunction();
                    break;
                }
                case AsmJsSymbol::ClosureFunction:
                    // we don't need to store any additional info in this case
                    break;
                default:
                    Assume(UNREACHED);
                }
            }
        }
        return true;
    }